

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

void __thiscall
dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor
          (CFGStructurizer *this,CFGNode *anchor,CFGNode *common_pdom,Vector<CFGNode_*> *constructs)

{
  pointer pcVar1;
  CFGNode *pCVar2;
  CFGNode *pCVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  bool bVar7;
  uint32_t uVar8;
  Id IVar9;
  Builder *this_00;
  CFGNode *to;
  CFGNode *pCVar10;
  CFGNode *this_01;
  CFGNode *to_00;
  CFGNode *to_01;
  pointer ppCVar11;
  size_t i;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  PHI outside_true_phi;
  PHI take_anchor_phi;
  PHI terminator_selector;
  PHI anchor_cond_phi;
  IncomingValue local_e8;
  PHI local_d8;
  PHI local_b0;
  undefined1 local_88 [16];
  vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_> local_78
  ;
  pointer local_60;
  PHI local_58;
  
  this_00 = SPIRVModule::get_builder(this->module);
  if ((anchor->ir).terminator.type != Condition) {
    __assert_fail("anchor->ir.terminator.type == Terminator::Type::Condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x16cf,
                  "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
                 );
  }
  ppCVar11 = (constructs->
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(constructs->
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar11 != 0x10) {
    __assert_fail("constructs.size() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x16d0,
                  "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
                 );
  }
  bVar7 = CFGNode::post_dominates(*ppCVar11,(anchor->ir).terminator.true_block);
  if (!bVar7) {
    bVar7 = CFGNode::post_dominates
                      (*(constructs->
                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                        )._M_impl.super__Vector_impl_data._M_start,
                       (anchor->ir).terminator.false_block);
    if (!bVar7) {
      __assert_fail("constructs[0]->post_dominates(anchor->ir.terminator.true_block) || constructs[0]->post_dominates(anchor->ir.terminator.false_block)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0x16d2,
                    "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
                   );
    }
  }
  bVar7 = CFGNode::post_dominates
                    ((constructs->
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[1],
                     (anchor->ir).terminator.true_block);
  if (!bVar7) {
    bVar7 = CFGNode::post_dominates
                      ((constructs->
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[1],
                       (anchor->ir).terminator.false_block);
    if (!bVar7) {
      __assert_fail("constructs[1]->post_dominates(anchor->ir.terminator.true_block) || constructs[1]->post_dominates(anchor->ir.terminator.false_block)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0x16d4,
                    "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
                   );
    }
  }
  to = create_helper_pred_block(this,anchor);
  pCVar10 = CFGNodePool::create_node(this->pool);
  this_01 = CFGNodePool::create_node(this->pool);
  to_00 = CFGNodePool::create_node(this->pool);
  to_01 = CFGNodePool::create_node(this->pool);
  pcVar1 = (anchor->name)._M_dataplus._M_p;
  local_88._0_8_ = &local_78;
  std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                       *)local_88,pcVar1,pcVar1 + (anchor->name)._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  append((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
         local_88,".anchor0");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&pCVar10->name,
            (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
            local_88);
  if ((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_> *)
      local_88._0_8_ != &local_78) {
    free_in_thread((void *)local_88._0_8_);
  }
  pcVar1 = (anchor->name)._M_dataplus._M_p;
  local_88._0_8_ = &local_78;
  std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                       *)local_88,pcVar1,pcVar1 + (anchor->name)._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  append((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
         local_88,".anchor1");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&this_01->name,
            (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
            local_88);
  if ((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_> *)
      local_88._0_8_ != &local_78) {
    free_in_thread((void *)local_88._0_8_);
  }
  pCVar10->immediate_dominator = anchor;
  this_01->immediate_dominator = anchor;
  ppCVar11 = (constructs->
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pCVar10->immediate_post_dominator = *ppCVar11;
  this_01->immediate_post_dominator = ppCVar11[1];
  pCVar2 = *ppCVar11;
  pCVar10->forward_post_visit_order = pCVar2->forward_post_visit_order;
  pCVar3 = ppCVar11[1];
  this_01->forward_post_visit_order = pCVar3->forward_post_visit_order;
  pCVar10->backward_post_visit_order = pCVar2->backward_post_visit_order;
  this_01->backward_post_visit_order = pCVar3->backward_post_visit_order;
  CFGNode::add_branch(pCVar10,to_00);
  CFGNode::add_branch(this_01,to_00);
  (pCVar10->ir).terminator.type = Branch;
  (pCVar10->ir).terminator.direct_block = to_00;
  (this_01->ir).terminator.type = Branch;
  (this_01->ir).terminator.direct_block = to_00;
  local_88._0_8_ = &local_78;
  pcVar1 = (anchor->name)._M_dataplus._M_p;
  std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                       *)local_88,pcVar1,pcVar1 + (anchor->name)._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  append((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
         local_88,".anchor-term");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&to_00->name,
            (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
            local_88);
  if ((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_> *)
      local_88._0_8_ != &local_78) {
    free_in_thread((void *)local_88._0_8_);
  }
  CFGNode::add_branch(to_00,to_01);
  (to_00->ir).terminator.type = Branch;
  (to_00->ir).terminator.direct_block = to_01;
  pcVar1 = (anchor->name)._M_dataplus._M_p;
  local_88._0_8_ = &local_78;
  std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
                       *)local_88,pcVar1,pcVar1 + (anchor->name)._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  append((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
         local_88,".anchor-dispatch");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  operator=(&to_01->name,
            (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *)
            local_88);
  if ((vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_> *)
      local_88._0_8_ != &local_78) {
    free_in_thread((void *)local_88._0_8_);
  }
  local_78.
  super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (IncomingValue *)0x0;
  local_78.
  super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
  ._M_impl.super__Vector_impl_data._M_finish = (IncomingValue *)0x0;
  local_88._0_8_ = (pointer)0x0;
  local_88[8] = false;
  uVar8 = SPIRVModule::allocate_id(this->module);
  local_88._0_4_ = uVar8;
  IVar9 = spv::Builder::makeBoolType(this_00);
  local_88._4_4_ = IVar9;
  local_b0._0_8_ = pCVar10;
  local_b0._8_4_ = spv::Builder::makeBoolConstant(this_00,true,false);
  if (local_78.
      super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_78.
      super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>::
    _M_realloc_insert<dxil_spv::IncomingValue>
              (&local_78,
               (iterator)
               local_78.
               super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
               ._M_impl.super__Vector_impl_data._M_finish,(IncomingValue *)&local_b0);
  }
  else {
    (local_78.
     super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
     ._M_impl.super__Vector_impl_data._M_finish)->block = local_b0._0_8_;
    *(ulong *)((long)local_78.
                     super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 8) =
         CONCAT44(local_b0._12_4_,local_b0._8_4_);
    local_78.
    super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((long)local_78.
                         super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 0x10);
  }
  local_b0._0_8_ = this_01;
  local_b0._8_4_ = spv::Builder::makeBoolConstant(this_00,false,false);
  if (local_78.
      super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_78.
      super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>::
    _M_realloc_insert<dxil_spv::IncomingValue>
              (&local_78,
               (iterator)
               local_78.
               super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
               ._M_impl.super__Vector_impl_data._M_finish,(IncomingValue *)&local_b0);
  }
  else {
    (local_78.
     super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
     ._M_impl.super__Vector_impl_data._M_finish)->block = local_b0._0_8_;
    *(ulong *)((long)local_78.
                     super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 8) =
         CONCAT44(local_b0._12_4_,local_b0._8_4_);
    local_78.
    super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((long)local_78.
                         super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 0x10);
  }
  traverse_dominated_blocks_and_rewrite_branch
            (this,anchor,
             *(constructs->
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              )._M_impl.super__Vector_impl_data._M_start,pCVar10);
  traverse_dominated_blocks_and_rewrite_branch
            (this,anchor,
             (constructs->
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             )._M_impl.super__Vector_impl_data._M_start[1],this_01);
  ppCVar11 = (to->pred).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppCVar4 = (to->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pCVar10 = *(constructs->
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  traverse_dominated_blocks_and_rewrite_branch(this,pCVar10->immediate_dominator,pCVar10,to);
  ppCVar5 = (to->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_60 = (to->pred).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pCVar10 = (constructs->
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            )._M_impl.super__Vector_impl_data._M_start[1];
  traverse_dominated_blocks_and_rewrite_branch(this,pCVar10->immediate_dominator,pCVar10,to);
  ppCVar6 = (constructs->
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar10 = *ppCVar6;
  if ((pCVar10->pred).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      *(pointer *)
       ((long)&(pCVar10->pred).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl + 8)) {
    pCVar10 = ppCVar6[1];
    if ((pCVar10->pred).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        *(pointer *)
         ((long)&(pCVar10->pred).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl + 8)) {
      uVar12 = (long)ppCVar4 - (long)ppCVar11;
      uVar13 = (long)uVar12 >> 3;
      local_b0.incoming.
      super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b0.incoming.
      super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ._M_impl.super__Vector_impl_data._M_finish = (IncomingValue *)0x0;
      local_b0.incoming.
      super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (IncomingValue *)0x0;
      local_b0._0_8_ = (CFGNode *)0x0;
      local_b0._8_4_ = local_b0._8_4_ & 0xffffff00;
      uVar8 = SPIRVModule::allocate_id(this->module);
      local_b0.id = uVar8;
      IVar9 = spv::Builder::makeBoolType(this_00);
      local_b0.type_id = IVar9;
      if (ppCVar4 != ppCVar11) {
        lVar14 = 0;
        do {
          local_d8._0_8_ =
               (to->pred).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar14];
          local_d8._8_4_ = spv::Builder::makeBoolConstant(this_00,true,false);
          if (local_b0.incoming.
              super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_b0.incoming.
              super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
            ::_M_realloc_insert<dxil_spv::IncomingValue>
                      (&local_b0.incoming,
                       (iterator)
                       local_b0.incoming.
                       super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(IncomingValue *)&local_d8);
          }
          else {
            (local_b0.incoming.
             super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
             ._M_impl.super__Vector_impl_data._M_finish)->block = (CFGNode *)local_d8._0_8_;
            *(ulong *)&(local_b0.incoming.
                        super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->id =
                 CONCAT44(local_d8._12_4_,local_d8._8_4_);
            local_b0.incoming.
            super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_b0.incoming.
                 super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          lVar14 = lVar14 + 1;
        } while (uVar13 + (uVar13 == 0) != lVar14);
      }
      uVar15 = (long)local_60 - (long)ppCVar5;
      ppCVar11 = (to->pred).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (uVar12 < (ulong)((long)(to->pred).
                                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar11)) {
        do {
          local_d8._0_8_ = ppCVar11[uVar13];
          local_d8._8_4_ = spv::Builder::makeBoolConstant(this_00,false,false);
          if (local_b0.incoming.
              super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_b0.incoming.
              super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
            ::_M_realloc_insert<dxil_spv::IncomingValue>
                      (&local_b0.incoming,
                       (iterator)
                       local_b0.incoming.
                       super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(IncomingValue *)&local_d8);
          }
          else {
            (local_b0.incoming.
             super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
             ._M_impl.super__Vector_impl_data._M_finish)->block = (CFGNode *)local_d8._0_8_;
            *(ulong *)&(local_b0.incoming.
                        super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->id =
                 CONCAT44(local_d8._12_4_,local_d8._8_4_);
            local_b0.incoming.
            super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_b0.incoming.
                 super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar13 = uVar13 + 1;
          ppCVar11 = (to->pred).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar13 < (ulong)((long)(to->pred).
                                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar11
                                 >> 3));
      }
      uVar12 = (long)uVar15 >> 3;
      CFGNode::add_branch(to,anchor);
      CFGNode::add_branch(to,to_01);
      (to->ir).terminator.type = Condition;
      (to->ir).terminator.true_block = anchor;
      (to->ir).terminator.false_block = to_01;
      (to->ir).terminator.direct_block = (CFGNode *)0x0;
      (to->ir).terminator.conditional_id = local_b0.id;
      local_d8.incoming.
      super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (IncomingValue *)0x0;
      local_d8.incoming.
      super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.incoming.
      super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ._M_impl.super__Vector_impl_data._M_finish = (IncomingValue *)0x0;
      local_d8._0_8_ = (CFGNode *)0x0;
      local_d8._8_4_ = local_d8._8_4_ & 0xffffff00;
      uVar8 = SPIRVModule::allocate_id(this->module);
      local_d8.id = uVar8;
      IVar9 = spv::Builder::makeBoolType(this_00);
      local_d8.type_id = IVar9;
      if (local_60 != ppCVar5) {
        lVar14 = 0;
        do {
          local_58._0_8_ =
               (to->pred).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar14];
          local_58._8_4_ = spv::Builder::makeBoolConstant(this_00,true,false);
          if (local_d8.incoming.
              super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_d8.incoming.
              super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
            ::_M_realloc_insert<dxil_spv::IncomingValue>
                      (&local_d8.incoming,
                       (iterator)
                       local_d8.incoming.
                       super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(IncomingValue *)&local_58);
          }
          else {
            (local_d8.incoming.
             super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
             ._M_impl.super__Vector_impl_data._M_finish)->block = (CFGNode *)local_58._0_8_;
            *(ulong *)&(local_d8.incoming.
                        super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->id =
                 CONCAT44(local_58._12_4_,local_58._8_4_);
            local_d8.incoming.
            super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_d8.incoming.
                 super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          lVar14 = lVar14 + 1;
        } while (uVar12 + (uVar12 == 0) != lVar14);
      }
      ppCVar11 = (to->pred).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (uVar15 < (ulong)((long)(to->pred).
                                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar11)) {
        do {
          local_58._0_8_ = ppCVar11[uVar12];
          local_58._8_4_ = spv::Builder::makeBoolConstant(this_00,false,false);
          if (local_d8.incoming.
              super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_d8.incoming.
              super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
            ::_M_realloc_insert<dxil_spv::IncomingValue>
                      (&local_d8.incoming,
                       (iterator)
                       local_d8.incoming.
                       super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(IncomingValue *)&local_58);
          }
          else {
            (local_d8.incoming.
             super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
             ._M_impl.super__Vector_impl_data._M_finish)->block = (CFGNode *)local_58._0_8_;
            *(ulong *)&(local_d8.incoming.
                        super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->id =
                 CONCAT44(local_58._12_4_,local_58._8_4_);
            local_d8.incoming.
            super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_d8.incoming.
                 super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar12 = uVar12 + 1;
          ppCVar11 = (to->pred).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar12 < (ulong)((long)(to->pred).
                                        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar11
                                 >> 3));
      }
      local_58.incoming.
      super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.incoming.
      super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ._M_impl.super__Vector_impl_data._M_finish = (IncomingValue *)0x0;
      local_58.incoming.
      super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (IncomingValue *)0x0;
      local_58._0_8_ = (CFGNode *)0x0;
      local_58._8_4_ = local_58._8_4_ & 0xffffff00;
      uVar8 = SPIRVModule::allocate_id(this->module);
      local_58.id = uVar8;
      IVar9 = spv::Builder::makeBoolType(this_00);
      local_58.type_id = IVar9;
      local_e8.id = local_88._0_4_;
      if (local_58.incoming.
          super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_58.incoming.
          super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_e8.block = anchor;
        std::
        vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>::
        _M_realloc_insert<dxil_spv::IncomingValue>
                  (&local_58.incoming,
                   (iterator)
                   local_58.incoming.
                   super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_e8);
      }
      else {
        (local_58.incoming.
         super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
         ._M_impl.super__Vector_impl_data._M_finish)->block = anchor;
        *(ulong *)&(local_58.incoming.
                    super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->id =
             CONCAT44(local_e8._12_4_,local_88._0_4_);
        local_58.incoming.
        super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_58.incoming.
             super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_e8.id = local_d8.id;
      local_e8.block = to;
      if (local_58.incoming.
          super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_58.incoming.
          super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>::
        _M_realloc_insert<dxil_spv::IncomingValue>
                  (&local_58.incoming,
                   (iterator)
                   local_58.incoming.
                   super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_e8);
      }
      else {
        (local_58.incoming.
         super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
         ._M_impl.super__Vector_impl_data._M_finish)->block = to;
        *(ulong *)&(local_58.incoming.
                    super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->id =
             CONCAT44(local_e8._12_4_,local_d8.id);
        local_58.incoming.
        super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_58.incoming.
             super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::
      emplace_back<dxil_spv::PHI>(&(to->ir).phi,&local_b0);
      std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::
      emplace_back<dxil_spv::PHI>(&(to->ir).phi,&local_d8);
      std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::
      emplace_back<dxil_spv::PHI>(&(to_00->ir).phi,(PHI *)local_88);
      (to_01->ir).terminator.conditional_id = local_58.id;
      (to_01->ir).terminator.type = Condition;
      ppCVar11 = (constructs->
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      (to_01->ir).terminator.true_block = *ppCVar11;
      (to_01->ir).terminator.false_block = ppCVar11[1];
      CFGNode::add_branch(to_01,*ppCVar11);
      CFGNode::add_branch(to_01,(constructs->
                                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                                )._M_impl.super__Vector_impl_data._M_start[1]);
      std::vector<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>::
      emplace_back<dxil_spv::PHI>(&(to_01->ir).phi,&local_58);
      if (local_58.incoming.
          super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        free_in_thread(local_58.incoming.
                       super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_d8.incoming.
          super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        free_in_thread(local_d8.incoming.
                       super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b0.incoming.
          super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        free_in_thread(local_b0.incoming.
                       super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_78.
          super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        free_in_thread(local_78.
                       super__Vector_base<dxil_spv::IncomingValue,_dxil_spv::ThreadLocalAllocator<dxil_spv::IncomingValue>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    __assert_fail("constructs[1]->pred.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                  ,0x1704,
                  "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
                 );
  }
  __assert_fail("constructs[0]->pred.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                ,0x1703,
                "void dxil_spv::CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(CFGNode *, CFGNode *, const Vector<CFGNode *> &)"
               );
}

Assistant:

void CFGStructurizer::collect_and_dispatch_control_flow_from_anchor(
	CFGNode *anchor, CFGNode *common_pdom, const Vector<CFGNode *> &constructs)
{
	auto &builder = module.get_builder();

	// If we have an anchor, it should collect all control flow, maybe dispatch itself, then dispatch to the constructs.
	// It must be a conditional branch, since it's too much of a mess to deal with switch.
	assert(anchor->ir.terminator.type == Terminator::Type::Condition);
	assert(constructs.size() == 2);
	assert(constructs[0]->post_dominates(anchor->ir.terminator.true_block) ||
	       constructs[0]->post_dominates(anchor->ir.terminator.false_block));
	assert(constructs[1]->post_dominates(anchor->ir.terminator.true_block) ||
	       constructs[1]->post_dominates(anchor->ir.terminator.false_block));

	auto *anchor_pred = create_helper_pred_block(anchor);

	auto *anchor_to_construct0 = pool.create_node();
	auto *anchor_to_construct1 = pool.create_node();
	auto *anchor_terminator = pool.create_node();
	auto *anchor_dispatcher = pool.create_node();

	anchor_to_construct0->name = anchor->name + ".anchor0";
	anchor_to_construct1->name = anchor->name + ".anchor1";

	anchor_to_construct0->immediate_dominator = anchor;
	anchor_to_construct1->immediate_dominator = anchor;
	anchor_to_construct0->immediate_post_dominator = constructs[0];
	anchor_to_construct1->immediate_post_dominator = constructs[1];
	anchor_to_construct0->forward_post_visit_order = constructs[0]->forward_post_visit_order;
	anchor_to_construct1->forward_post_visit_order = constructs[1]->forward_post_visit_order;
	anchor_to_construct0->backward_post_visit_order = constructs[0]->backward_post_visit_order;
	anchor_to_construct1->backward_post_visit_order = constructs[1]->backward_post_visit_order;

	anchor_to_construct0->add_branch(anchor_terminator);
	anchor_to_construct1->add_branch(anchor_terminator);
	anchor_to_construct0->ir.terminator.type = Terminator::Type::Branch;
	anchor_to_construct0->ir.terminator.direct_block = anchor_terminator;
	anchor_to_construct1->ir.terminator.type = Terminator::Type::Branch;
	anchor_to_construct1->ir.terminator.direct_block = anchor_terminator;
	anchor_terminator->name = anchor->name + ".anchor-term";
	anchor_terminator->add_branch(anchor_dispatcher);
	anchor_terminator->ir.terminator.type = Terminator::Type::Branch;
	anchor_terminator->ir.terminator.direct_block = anchor_dispatcher;
	anchor_dispatcher->name = anchor->name + ".anchor-dispatch";

	PHI terminator_selector;
	terminator_selector.id = module.allocate_id();
	terminator_selector.type_id = builder.makeBoolType();
	terminator_selector.incoming.push_back({ anchor_to_construct0, builder.makeBoolConstant(true) });
	terminator_selector.incoming.push_back({ anchor_to_construct1, builder.makeBoolConstant(false) });

	traverse_dominated_blocks_and_rewrite_branch(anchor, constructs[0], anchor_to_construct0);
	traverse_dominated_blocks_and_rewrite_branch(anchor, constructs[1], anchor_to_construct1);

	size_t cutoff_normal_path = anchor_pred->pred.size();
	traverse_dominated_blocks_and_rewrite_branch(constructs[0]->immediate_dominator, constructs[0], anchor_pred);
	size_t cutoff_path0 = anchor_pred->pred.size();
	traverse_dominated_blocks_and_rewrite_branch(constructs[1]->immediate_dominator, constructs[1], anchor_pred);

	assert(constructs[0]->pred.empty());
	assert(constructs[1]->pred.empty());

	// Branch to anchor as normal if we have a pre-existing pred.
	PHI take_anchor_phi;
	take_anchor_phi.id = module.allocate_id();
	take_anchor_phi.type_id = builder.makeBoolType();
	for (size_t i = 0; i < cutoff_normal_path; i++)
		take_anchor_phi.incoming.push_back({ anchor_pred->pred[i], builder.makeBoolConstant(true) });
	for (size_t i = cutoff_normal_path; i < anchor_pred->pred.size(); i++)
		take_anchor_phi.incoming.push_back({ anchor_pred->pred[i], builder.makeBoolConstant(false) });

	anchor_pred->add_branch(anchor);
	anchor_pred->add_branch(anchor_dispatcher);
	anchor_pred->ir.terminator.type = Terminator::Type::Condition;
	anchor_pred->ir.terminator.true_block = anchor;
	anchor_pred->ir.terminator.false_block = anchor_dispatcher;
	anchor_pred->ir.terminator.direct_block = nullptr;
	anchor_pred->ir.terminator.conditional_id = take_anchor_phi.id;

	PHI outside_true_phi;
	outside_true_phi.id = module.allocate_id();
	outside_true_phi.type_id = builder.makeBoolType();
	for (size_t i = 0; i < cutoff_path0; i++)
		outside_true_phi.incoming.push_back({ anchor_pred->pred[i], builder.makeBoolConstant(true) });
	for (size_t i = cutoff_path0; i < anchor_pred->pred.size(); i++)
		outside_true_phi.incoming.push_back({ anchor_pred->pred[i], builder.makeBoolConstant(false) });

	PHI anchor_cond_phi;
	anchor_cond_phi.id = module.allocate_id();
	anchor_cond_phi.type_id = builder.makeBoolType();
	// If we took the path through anchor, use that conditional. Otherwise, use the selector between path 0 or 1.
	anchor_cond_phi.incoming.push_back({ anchor, terminator_selector.id });
	anchor_cond_phi.incoming.push_back({ anchor_pred, outside_true_phi.id });

	anchor_pred->ir.phi.push_back(std::move(take_anchor_phi));
	anchor_pred->ir.phi.push_back(std::move(outside_true_phi));
	anchor_terminator->ir.phi.push_back(std::move(terminator_selector));
	anchor_dispatcher->ir.terminator.conditional_id = anchor_cond_phi.id;
	anchor_dispatcher->ir.terminator.type = Terminator::Type::Condition;
	anchor_dispatcher->ir.terminator.true_block = constructs[0];
	anchor_dispatcher->ir.terminator.false_block = constructs[1];
	anchor_dispatcher->add_branch(constructs[0]);
	anchor_dispatcher->add_branch(constructs[1]);
	anchor_dispatcher->ir.phi.push_back(std::move(anchor_cond_phi));
}